

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

Am_Drawonable * Am_Drawonable::Get_Root_Drawonable(char *screen)

{
  bool bVar1;
  Am_Drawonable *local_28;
  Am_Drawonable *draw;
  Display *new_display;
  char *screen_local;
  
  new_display = (Display *)screen;
  bVar1 = Screen_Manager::Get(&Scrn_Mgr,screen,(Display **)&draw,&local_28);
  if (bVar1) {
    screen_local = (char *)local_28;
  }
  else {
    draw = (Am_Drawonable *)XOpenDisplay(new_display);
    if (draw == (Am_Drawonable *)0x0) {
      Am_Error("** Couldn\'t open display.\n");
    }
    screen_local = (char *)make_root_drawonable((char *)new_display,(Display *)draw);
  }
  return (Am_Drawonable *)screen_local;
}

Assistant:

Am_Drawonable *
Am_Drawonable::Get_Root_Drawonable(const char *screen)
{

  // if this screen's root drawonable has already been requested, just
  // return it
  Display *new_display;
  Am_Drawonable *draw;
  if (Scrn_Mgr.Get(screen, new_display, draw))
    return draw;
  new_display = XOpenDisplay(screen);
  if (!new_display)
    Am_Error("** Couldn't open display.\n");

  // DEBUGGING STUFF IN X
  // This should be commented out most of the time.
  // If you start getting X errors and want to debug them quickly,
  // uncomment these lines and run your program again.  This will cause
  // X to crash through our own error handler, at the correct error location,
  // instead of crashing sometime randomly after the error occurs.  Also, the
  // stack is preserved, which is very useful.
  // SYNCHRONOUS DRAWING IS VERY SLOW.  It should NOT be turned on except
  // when debugging!
  // af1x 5-21-96  Uncomment the following 2 lines to easily debug in X
  // XSynchronize(new_display, 1);  // turn on synchronous drawing calls
  // XSetErrorHandler(amulet_x_error); // use our error handler to preserve stack

  draw = make_root_drawonable(screen, new_display);
  return draw;
}